

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Extractor.cpp
# Opt level: O2

void __thiscall Extractor::setFile(Extractor *this,char *file_name)

{
  FILE *pFVar1;
  runtime_error *this_00;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->_file != (FILE *)0x0) {
    _free(this,file_name);
  }
  std::__cxx11::string::assign((char *)&this->_file_name);
  pFVar1 = fopen(file_name,"rb");
  this->_file = (FILE *)pFVar1;
  if (pFVar1 != (FILE *)0x0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_78,"unable to open file (",&local_79);
  std::operator+(&local_58,&local_78,file_name);
  std::operator+(&local_38,&local_58,")");
  std::runtime_error::runtime_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Extractor::setFile(const char *file_name)
{
	if (_file) {
		_free();
	}
	_file_name = file_name;
	_file = fopen(file_name, "rb");
	if (!_file) {
		throw std::runtime_error(std::string("unable to open file (") + file_name + ")");
	}
}